

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.h
# Opt level: O0

ostream * embree::operator<<(ostream *cout,Token *t)

{
  ostream *poVar1;
  int *in_RSI;
  ostream *in_RDI;
  ostream *local_8;
  
  if (*in_RSI == 0) {
    local_8 = std::operator<<(in_RDI,"eof");
  }
  else if (*in_RSI == 1) {
    poVar1 = std::operator<<(in_RDI,"Char(");
    poVar1 = std::operator<<(poVar1,(char)in_RSI[1]);
    local_8 = std::operator<<(poVar1,")");
  }
  else if (*in_RSI == 2) {
    poVar1 = std::operator<<(in_RDI,"Int(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
    local_8 = std::operator<<(poVar1,")");
  }
  else if (*in_RSI == 3) {
    poVar1 = std::operator<<(in_RDI,"Float(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)in_RSI[1]);
    local_8 = std::operator<<(poVar1,")");
  }
  else if (*in_RSI == 4) {
    poVar1 = std::operator<<(in_RDI,"Id(");
    poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 2));
    local_8 = std::operator<<(poVar1,")");
  }
  else if (*in_RSI == 5) {
    poVar1 = std::operator<<(in_RDI,"String(");
    poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 2));
    local_8 = std::operator<<(poVar1,")");
  }
  else if (*in_RSI == 6) {
    poVar1 = std::operator<<(in_RDI,"Symbol(");
    poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 2));
    local_8 = std::operator<<(poVar1,")");
  }
  else {
    local_8 = std::operator<<(in_RDI,"unknown");
  }
  return local_8;
}

Assistant:

std::ostream& operator<<(std::ostream& cout, const Token& t)
    {
      if (t.ty == TY_EOF) return cout << "eof";
      if (t.ty == TY_CHAR) return cout << "Char(" << t.c << ")";
      if (t.ty == TY_INT) return cout << "Int(" << t.i << ")";
      if (t.ty == TY_FLOAT) return cout << "Float(" << t.f << ")";
      if (t.ty == TY_IDENTIFIER) return cout << "Id(" << t.str << ")";
      if (t.ty == TY_STRING) return cout << "String(" << t.str << ")";
      if (t.ty == TY_SYMBOL) return cout << "Symbol(" << t.str << ")";
      return cout << "unknown";
    }